

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::GetRemainingArguments
          (CommandLineArguments *this,int *argc,char ***argv)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  char **ppcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  int local_3c;
  int cnt;
  char **args;
  size_type cc;
  size_type size;
  char ***argv_local;
  int *argc_local;
  CommandLineArguments *this_local;
  
  sVar2 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                    ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (sVar2 - this->Internals->LastArgument) + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppcVar4 = (char **)operator_new__(uVar3);
  lVar5 = std::__cxx11::string::size();
  pcVar6 = (char *)operator_new__(lVar5 + 1);
  *ppcVar4 = pcVar6;
  pcVar6 = *ppcVar4;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar6,pcVar7);
  local_3c = 1;
  args = (char **)this->Internals->LastArgument;
  while( true ) {
    args = (char **)((long)args + 1);
    ppcVar8 = (char **)std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                                 ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                  this->Internals);
    if (ppcVar8 <= args) break;
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals,
               (size_type)args);
    lVar5 = std::__cxx11::string::size();
    pcVar6 = (char *)operator_new__(lVar5 + 1);
    ppcVar4[local_3c] = pcVar6;
    pcVar6 = ppcVar4[local_3c];
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals,
               (size_type)args);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar6,pcVar7);
    local_3c = local_3c + 1;
  }
  *argc = local_3c;
  *argv = ppcVar4;
  return;
}

Assistant:

void CommandLineArguments::GetRemainingArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size =
    this->Internals->Argv.size() - this->Internals->LastArgument + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[size];
  args[0] = new char[this->Internals->Argv0.size() + 1];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for (cc = this->Internals->LastArgument + 1;
       cc < this->Internals->Argv.size(); cc++) {
    args[cnt] = new char[this->Internals->Argv[cc].size() + 1];
    strcpy(args[cnt], this->Internals->Argv[cc].c_str());
    cnt++;
  }
  *argc = cnt;
  *argv = args;
}